

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void * xmalloc(size_t size)

{
  void *ptr;
  size_t size_local;
  
  if (size == 0) {
    size_local = 0;
  }
  else {
    size_local = (size_t)malloc(size);
    if ((void *)size_local == (void *)0x0) {
      die("not enough memory");
    }
  }
  return (void *)size_local;
}

Assistant:

static inline void* xmalloc(size_t size) {
    if (size == 0)
        return NULL;
    void* ptr = malloc(size);
    if (!ptr)
        die("not enough memory");
    return ptr;
}